

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O1

void block_op(vm *v,instruction *inst)

{
  type_pointer pfVar1;
  uint32 *puVar2;
  int iVar3;
  type_pointer pfVar4;
  func_type bt_00;
  long lVar5;
  func_type bt;
  undefined8 local_28;
  byte *pbStack_20;
  undefined8 local_18;
  byte *pbStack_10;
  
  iVar3 = *inst->arg;
  lVar5 = (long)iVar3;
  local_18 = 1;
  pbStack_10 = (byte *)0x0;
  local_28 = 0;
  pbStack_20 = (byte *)0x0;
  if (lVar5 < 0) {
    switch(iVar3) {
    case -4:
      pbStack_20 = fiveBlockReturnType + 3;
      break;
    case -3:
      pbStack_20 = fiveBlockReturnType + 2;
      break;
    case -2:
      pbStack_20 = fiveBlockReturnType + 1;
      break;
    case -1:
      pbStack_20 = fiveBlockReturnType;
      break;
    default:
      local_18 = 0;
    }
  }
  else {
    pfVar4 = (v->m->type_sec).type_segment_addr;
    pfVar1 = pfVar4 + lVar5;
    local_28 = *(undefined8 *)pfVar1;
    pbStack_20 = pfVar1->param_types;
    puVar2 = &pfVar4[lVar5].return_count;
    local_18 = *(undefined8 *)puVar2;
    pbStack_10 = *(byte **)(puVar2 + 2);
  }
  bt_00.param_types = pbStack_20;
  bt_00._0_8_ = local_28;
  bt_00._16_8_ = local_18;
  bt_00.return_types = pbStack_10;
  enterBlock(v,'\x02',bt_00,(vec *)((long)inst->arg + 8));
  return;
}

Assistant:

void block_op(vm *v, instruction *inst) {
    blockArgs *ba = (blockArgs *) inst->arg;
    func_type bt = get_block_type(v, ba->blockType);
    enterBlock(v, Block, bt, &ba->instructions);
}